

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O3

int FmsDataCollectionAddFieldDescriptor(FmsDataCollection dc,char *fd_name,FmsFieldDescriptor *fd)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  FmsFieldDescriptor __ptr;
  char *pcVar4;
  int iVar5;
  FmsFieldDescriptor *local_40;
  
  if (dc == (FmsDataCollection)0x0) {
    return 1;
  }
  if (fd == (FmsFieldDescriptor *)0x0) {
    return 2;
  }
  uVar1 = dc->num_fds;
  local_40 = dc->fds;
  uVar2 = 1;
  do {
    uVar3 = uVar2;
    uVar2 = uVar3 * 2;
  } while (uVar3 < uVar1 + 1);
  if (uVar3 >> 1 < uVar1) {
LAB_00108245:
    __ptr = (FmsFieldDescriptor)calloc(1,0x28);
    if (__ptr == (FmsFieldDescriptor)0x0) {
      return 3;
    }
    iVar5 = 0;
    if (fd_name == (char *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar4 = strdup(fd_name);
      if (pcVar4 == (char *)0x0) {
        free(__ptr);
        goto LAB_0010827f;
      }
    }
    __ptr->name = pcVar4;
    dc->num_fds = uVar1 + 1;
    local_40[uVar1] = __ptr;
    *fd = __ptr;
  }
  else {
    local_40 = (FmsFieldDescriptor *)realloc(local_40,uVar3 << 3);
    if (local_40 != (FmsFieldDescriptor *)0x0) {
      dc->fds = local_40;
      goto LAB_00108245;
    }
LAB_0010827f:
    iVar5 = 3;
  }
  return iVar5;
}

Assistant:

int FmsDataCollectionAddFieldDescriptor(FmsDataCollection dc,
                                        const char *fd_name,
                                        FmsFieldDescriptor *fd) {
  if (!dc) { E_RETURN(1); }
  if (!fd) { E_RETURN(2); }
  const FmsInt num_fds = dc->num_fds;
  FmsFieldDescriptor *fds = dc->fds;
  // Reallocate dc->fds, if necessary
  const FmsInt nc = NextPow2(num_fds + 1);
  if (num_fds <= nc/2) {
    fds = realloc(fds, nc*sizeof(*fds));
    if (fds == NULL) { E_RETURN(3); }
    dc->fds = fds;
  }
  FmsFieldDescriptor new_fd;
  new_fd = calloc(1, sizeof(*new_fd));
  if (new_fd == NULL) { E_RETURN(3); }
  // On error, call free(new_fd)
  if (FmsCopyString(fd_name, &new_fd->name)) { free(new_fd); E_RETURN(3); }
  // Update the field descriptor
  dc->num_fds = num_fds + 1;
  dc->fds[num_fds] = new_fd;
  *fd = new_fd;
  return 0;
}